

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O0

Reals __thiscall Omega_h::get_nelems_per_elem(Omega_h *this,Mesh *mesh,Reals *v2m)

{
  Int dim;
  void *extraout_RDX;
  Real RVar1;
  Reals RVar2;
  Read<double> local_60 [2];
  Read<double> local_40;
  undefined1 local_30 [8];
  Reals complexity;
  Reals *v2m_local;
  Mesh *mesh_local;
  
  complexity.write_.shared_alloc_.direct_ptr = v2m;
  Read<double>::Read(&local_40,v2m);
  get_complexity_per_elem((Omega_h *)local_30,mesh,&local_40);
  Read<double>::~Read(&local_40);
  Read<double>::Read(local_60,(Read<double> *)local_30);
  dim = Mesh::dim(mesh);
  RVar1 = typical_unit_simplex_size(dim);
  multiply_each_by<double>(this,local_60,1.0 / RVar1);
  Read<double>::~Read(local_60);
  Read<double>::~Read((Read<double> *)local_30);
  RVar2.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar2.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar2.write_.shared_alloc_;
}

Assistant:

Reals get_nelems_per_elem(Mesh* mesh, Reals v2m) {
  auto complexity = get_complexity_per_elem(mesh, v2m);
  return multiply_each_by(
      complexity, 1.0 / typical_unit_simplex_size(mesh->dim()));
}